

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphviz.cpp
# Opt level: O0

Style * __thiscall
ccs::Dumper::tallyStyle_abi_cxx11_(Style *__return_storage_ptr__,Dumper *this,Tally *tally)

{
  mapped_type *pmVar1;
  long local_150;
  allocator local_f9;
  key_type local_f8;
  allocator local_d1;
  key_type local_d0;
  allocator local_a9;
  key_type local_a8;
  allocator local_81;
  key_type local_80;
  allocator local_49;
  key_type local_48;
  undefined1 local_21;
  Tally *local_20;
  Tally *tally_local;
  Dumper *this_local;
  Style *style;
  
  local_21 = 0;
  local_20 = tally;
  tally_local = (Tally *)this;
  this_local = (Dumper *)__return_storage_ptr__;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(__return_storage_ptr__);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"nodesep",&local_49);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](__return_storage_ptr__,&local_48);
  std::__cxx11::string::operator=((string *)pmVar1,"2.0");
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_80,"color",&local_81);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](__return_storage_ptr__,&local_80);
  std::__cxx11::string::operator=((string *)pmVar1,"blue");
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a8,"label",&local_a9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](__return_storage_ptr__,&local_a8);
  std::__cxx11::string::operator=((string *)pmVar1,"");
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  if (local_20 == (Tally *)0x0) {
    local_150 = 0;
  }
  else {
    local_150 = __dynamic_cast(local_20,&Tally::typeinfo,&AndTally::typeinfo,0);
  }
  if (local_150 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_f8,"shape",&local_f9);
    pmVar1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](__return_storage_ptr__,&local_f8);
    std::__cxx11::string::operator=((string *)pmVar1,"invtriangle");
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_d0,"shape",&local_d1);
    pmVar1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](__return_storage_ptr__,&local_d0);
    std::__cxx11::string::operator=((string *)pmVar1,"triangle");
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  }
  return __return_storage_ptr__;
}

Assistant:

Style Dumper::tallyStyle(const Tally &tally) const {
  Style style;
  style["nodesep"] = "2.0";
  style["color"] = "blue";
  style["label"] = "";

  if (dynamic_cast<const AndTally *>(&tally)) {
    style["shape"] = "triangle";
  } else {
    style["shape"] = "invtriangle";
  }

  return style;
}